

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O2

void __thiscall
correctness_mul_merge_randomized_Test::TestBody(correctness_mul_merge_randomized_Test *this)

{
  int a_00;
  char *in_R9;
  int iVar1;
  long lVar2;
  bool bVar3;
  AssertionResult gtest_ar_;
  AssertHelper local_118;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  vector<big_integer,_std::allocator<big_integer>_> x;
  string local_f0;
  vector<big_integer,_std::allocator<big_integer>_> local_d0;
  vector<big_integer,_std::allocator<big_integer>_> local_b8;
  big_integer b;
  big_integer a;
  
  for (iVar1 = 0; iVar1 != 10; iVar1 = iVar1 + 1) {
    x.super__Vector_base<big_integer,_std::allocator<big_integer>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    x.super__Vector_base<big_integer,_std::allocator<big_integer>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    x.super__Vector_base<big_integer,_std::allocator<big_integer>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    lVar2 = 1000;
    while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
      a_00 = anon_unknown.dwarf_a16b::myrand();
      big_integer::big_integer(&a,a_00);
      std::vector<big_integer,_std::allocator<big_integer>_>::emplace_back<big_integer>(&x,&a);
      big_integer::~big_integer(&a);
    }
    std::vector<big_integer,_std::allocator<big_integer>_>::vector(&local_b8,&x);
    anon_unknown.dwarf_a16b::merge_all<big_integer>(&a,&local_b8);
    std::vector<big_integer,_std::allocator<big_integer>_>::~vector(&local_b8);
    std::vector<big_integer,_std::allocator<big_integer>_>::vector(&local_d0,&x);
    anon_unknown.dwarf_a16b::merge_all<big_integer>(&b,&local_d0);
    std::vector<big_integer,_std::allocator<big_integer>_>::~vector(&local_d0);
    gtest_ar_.success_ = operator==(&a,&b);
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!gtest_ar_.success_) {
      testing::Message::Message((Message *)&local_110);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_f0,(internal *)&gtest_ar_,(AssertionResult *)0x1353c5,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
                 ,0x2c2,local_f0._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      std::__cxx11::string::~string((string *)&local_f0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_110);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    big_integer::~big_integer(&b);
    big_integer::~big_integer(&a);
    std::vector<big_integer,_std::allocator<big_integer>_>::~vector(&x);
  }
  return;
}

Assistant:

TEST(correctness, mul_merge_randomized)
{
    for (unsigned itn = 0; itn != number_of_iterations; ++itn)
    {
        std::vector<big_integer> x;
        for (size_t i = 0; i != number_of_multipliers; ++i)
            x.push_back(myrand());

        big_integer a = merge_all(x);
        big_integer b = merge_all(x);

        EXPECT_TRUE(a == b);
    }
}